

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * get_object_item(cJSON *object,char *name,cJSON_bool case_sensitive)

{
  char *pcVar1;
  int iVar2;
  __int32_t **pp_Var3;
  long lVar4;
  cJSON *pcVar5;
  char *__s2;
  
  if (name != (char *)0x0 && object != (cJSON *)0x0) {
    pcVar5 = object->child;
    if (case_sensitive == 0) {
      for (; pcVar5 != (cJSON *)0x0; pcVar5 = pcVar5->next) {
        pcVar1 = pcVar5->string;
        if (pcVar1 != (char *)0x0) {
          __s2 = name;
          if (pcVar1 == name) {
LAB_001043d7:
            if (__s2 != (char *)0x0) {
              return pcVar5;
            }
            return (cJSON *)0x0;
          }
          pp_Var3 = __ctype_tolower_loc();
          lVar4 = 0;
          while ((*pp_Var3)[(byte)name[lVar4]] == (*pp_Var3)[(byte)pcVar1[lVar4]]) {
            __s2 = pcVar1;
            if (name[lVar4] == 0) goto LAB_001043d7;
            lVar4 = lVar4 + 1;
          }
        }
      }
    }
    else {
      for (; pcVar5 != (cJSON *)0x0; pcVar5 = pcVar5->next) {
        __s2 = pcVar5->string;
        if (__s2 == (char *)0x0) {
          __s2 = (char *)0x0;
          goto LAB_001043d7;
        }
        iVar2 = strcmp(name,__s2);
        if (iVar2 == 0) goto LAB_001043d7;
      }
    }
  }
  return (cJSON *)0x0;
}

Assistant:

static cJSON *get_object_item(const cJSON * const object, const char * const name, const cJSON_bool case_sensitive)
{
    cJSON *current_element = NULL;

    if ((object == NULL) || (name == NULL))
    {
        return NULL;
    }

    current_element = object->child;
    if (case_sensitive)
    {
        while ((current_element != NULL) && (current_element->string != NULL) && (strcmp(name, current_element->string) != 0))
        {
            current_element = current_element->next;
        }
    }
    else
    {
        while ((current_element != NULL) && (case_insensitive_strcmp((const unsigned char*)name, (const unsigned char*)(current_element->string)) != 0))
        {
            current_element = current_element->next;
        }
    }

    if ((current_element == NULL) || (current_element->string == NULL)) {
        return NULL;
    }

    return current_element;
}